

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O2

bool Kumu::read_BER(byte_t *buf,ui64_t *val)

{
  long lVar1;
  ulong uVar2;
  byte *pbVar3;
  
  if ((val != (ui64_t *)0x0 && buf != (byte_t *)0x0) && ((char)*buf < '\0')) {
    *val = 0;
    if ((byte)(*buf & 0xf) < 9) {
      lVar1 = (ulong)(*buf & 0xf) * 8;
      pbVar3 = buf + 1;
      uVar2 = 0;
      while (lVar1 = lVar1 + -8, lVar1 != -8) {
        if ((ulong)*pbVar3 != 0) {
          uVar2 = uVar2 | (ulong)*pbVar3 << ((byte)lVar1 & 0x3f);
          *val = uVar2;
        }
        pbVar3 = pbVar3 + 1;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool
Kumu::read_BER(const byte_t* buf, ui64_t* val)
{
  ui8_t ber_size, i;
  
  if ( buf == 0 || val == 0 )
    return false;

  if ( ( *buf & 0x80 ) == 0 )
    return false;

  *val = 0;
  ber_size = ( *buf & 0x0f ) + 1;

  if ( ber_size > 9 )
    return false;

  for ( i = 1; i < ber_size; i++ )
    {
      if ( buf[i] > 0 )
	*val |= (ui64_t)buf[i] << ( ( ( ber_size - 1 ) - i ) * 8 );
    }

  return true;
}